

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm3.c
# Opt level: O2

void sm3(void *in,unsigned_long inlen,void *out)

{
  int iVar1;
  uint8_t local_110;
  undefined1 local_10f;
  undefined1 local_10e;
  byte local_10d;
  undefined1 local_10c;
  undefined1 local_10b;
  undefined1 local_10a;
  char local_109;
  sm3_context local_108;
  
  local_108.total[0] = 0;
  local_108.total[1] = 0;
  local_108.state[0] = 0x7380166f;
  local_108.state[1] = 0x4914b2b9;
  local_108.state[2] = 0x172442d7;
  local_108.state[3] = 0xda8a0600;
  local_108.state[4] = 0xa96f30bc;
  local_108.state[5] = 0x163138aa;
  local_108.state[6] = 0xe38dee4d;
  local_108.state[7] = 0xb0fb0e4e;
  sm3_update(&local_108,(uint8_t *)in,inlen);
  iVar1 = local_108.total[1] << 3;
  local_10d = (byte)iVar1 | local_108.total[0]._3_1_ >> 5;
  local_109 = (char)local_108.total[0] * '\b';
  local_110 = (uint8_t)((uint)iVar1 >> 0x18);
  local_10f = (undefined1)((uint)iVar1 >> 0x10);
  local_10e = (undefined1)((uint)iVar1 >> 8);
  local_10c = (undefined1)(local_108.total[0] >> 0x15);
  local_10b = (undefined1)(local_108.total[0] >> 0xd);
  local_10a = (undefined1)(local_108.total[0] >> 5);
  sm3_update(&local_108,sm3_padding,
             (ulong)(((uint)(0x37 < (local_108.total[0] & 0x3f)) << 6 | 0x38) -
                    (local_108.total[0] & 0x3f)));
  sm3_update(&local_108,&local_110,8);
  *(uint32_t *)out =
       local_108.state[0] >> 0x18 | (local_108.state[0] & 0xff0000) >> 8 |
       (local_108.state[0] & 0xff00) << 8 | local_108.state[0] << 0x18;
  *(uint32_t *)((long)out + 4) =
       local_108.state[1] >> 0x18 | (local_108.state[1] & 0xff0000) >> 8 |
       (local_108.state[1] & 0xff00) << 8 | local_108.state[1] << 0x18;
  *(uint32_t *)((long)out + 8) =
       local_108.state[2] >> 0x18 | (local_108.state[2] & 0xff0000) >> 8 |
       (local_108.state[2] & 0xff00) << 8 | local_108.state[2] << 0x18;
  *(uint32_t *)((long)out + 0xc) =
       local_108.state[3] >> 0x18 | (local_108.state[3] & 0xff0000) >> 8 |
       (local_108.state[3] & 0xff00) << 8 | local_108.state[3] << 0x18;
  *(uint32_t *)((long)out + 0x10) =
       local_108.state[4] >> 0x18 | (local_108.state[4] & 0xff0000) >> 8 |
       (local_108.state[4] & 0xff00) << 8 | local_108.state[4] << 0x18;
  *(uint32_t *)((long)out + 0x14) =
       local_108.state[5] >> 0x18 | (local_108.state[5] & 0xff0000) >> 8 |
       (local_108.state[5] & 0xff00) << 8 | local_108.state[5] << 0x18;
  *(uint32_t *)((long)out + 0x18) =
       local_108.state[6] >> 0x18 | (local_108.state[6] & 0xff0000) >> 8 |
       (local_108.state[6] & 0xff00) << 8 | local_108.state[6] << 0x18;
  *(uint32_t *)((long)out + 0x1c) =
       local_108.state[7] >> 0x18 | (local_108.state[7] & 0xff0000) >> 8 |
       (local_108.state[7] & 0xff00) << 8 | local_108.state[7] << 0x18;
  return;
}

Assistant:

void sm3(const void *in, unsigned long inlen, void* out)
{
	struct sm3_context ctx;
	sm3_init(&ctx);
	sm3_update(&ctx, (const uint8_t *)in, (size_t)inlen);
	sm3_final(&ctx, (uint8_t*)out);
}